

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * whereForeignKeys(Parse *pParse,Table *pTab)

{
  char *local_28;
  char *zWhere;
  FKey *p;
  Table *pTab_local;
  Parse *pParse_local;
  
  local_28 = (char *)0x0;
  for (zWhere = (char *)sqlite3FkReferences(pTab); zWhere != (char *)0x0;
      zWhere = *(char **)(zWhere + 0x18)) {
    local_28 = whereOrName(pParse->db,local_28,(char *)**(undefined8 **)zWhere);
  }
  return local_28;
}

Assistant:

static char *whereForeignKeys(Parse *pParse, Table *pTab){
  FKey *p;
  char *zWhere = 0;
  for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
    zWhere = whereOrName(pParse->db, zWhere, p->pFrom->zName);
  }
  return zWhere;
}